

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O1

void Am_Stop_Timer(Am_Object *obj,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *this;
  Am_Object *this_00;
  
  Am_Value_List::Start(&am_timing_events);
  bVar1 = Am_Value_List::Last(&am_timing_events);
  while( true ) {
    if (bVar1) {
      return;
    }
    this = Am_Value_List::Get(&am_timing_events);
    this_00 = (Am_Object *)Am_Value::operator_cast_to_void_(this);
    bVar1 = Am_Object::operator==(this_00,obj);
    if ((bVar1) && (*(Am_Slot_Key *)&this_00[1].data == slot)) break;
    Am_Value_List::Next(&am_timing_events);
    bVar1 = Am_Value_List::Last(&am_timing_events);
  }
  Am_Value_List::Delete(&am_timing_events,true);
  Am_Time::~Am_Time((Am_Time *)(this_00 + 4));
  Am_Time::~Am_Time((Am_Time *)(this_00 + 3));
  Am_Time::~Am_Time((Am_Time *)(this_00 + 2));
  Am_Object::~Am_Object(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void
Am_Stop_Timer(Am_Object obj, Am_Slot_Key slot)
{
  Am_Interactor_Time_Event *e;
  for (am_timing_events.Start(); !am_timing_events.Last();
       am_timing_events.Next()) {
    e = (Am_Interactor_Time_Event *)(Am_Ptr)am_timing_events.Get();
    if (e->object == obj && e->method_slot == slot) {
      am_timing_events.Delete();
      delete e;
      return;
    }
  }
  //Am_ERROR("Am_Stop_Timer on " << obj << " slot " << slot
  //     << " but hasn't been registered")
}